

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::csharp::WriteDocCommentBody<google::protobuf::FieldDescriptor>
               (Printer *printer,FieldDescriptor *descriptor)

{
  bool bVar1;
  SourceLocation local_f8;
  undefined1 local_80 [8];
  SourceLocation location;
  FieldDescriptor *descriptor_local;
  Printer *printer_local;
  
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)descriptor;
  SourceLocation::SourceLocation((SourceLocation *)local_80);
  bVar1 = FieldDescriptor::GetSourceLocation
                    ((FieldDescriptor *)
                     location.leading_detached_comments.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(SourceLocation *)local_80);
  if (bVar1) {
    SourceLocation::SourceLocation(&local_f8,(SourceLocation *)local_80);
    WriteDocCommentBodyImpl(printer,&local_f8);
    SourceLocation::~SourceLocation(&local_f8);
  }
  SourceLocation::~SourceLocation((SourceLocation *)local_80);
  return;
}

Assistant:

static void WriteDocCommentBody(io::Printer* printer,
                                const DescriptorType* descriptor) {
  SourceLocation location;
  if (descriptor->GetSourceLocation(&location)) {
    WriteDocCommentBodyImpl(printer, location);
  }
}